

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::SuspendIdleDecommitNonLeaf(HeapInfo *this)

{
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::SuspendIdleDecommit
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerPageAllocator);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::SuspendIdleDecommit
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerLargeBlockPageAllocator);
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::SuspendIdleDecommit
            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&this->recyclerWithBarrierPageAllocator);
  return;
}

Assistant:

void
HeapInfo::SuspendIdleDecommitNonLeaf()
{
    ForEachNonLeafPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->SuspendIdleDecommit();
    });
}